

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O1

void __thiscall CNscPStackEntry::MakeRoom(CNscPStackEntry *this,size_t nSize)

{
  size_t __n;
  uchar *__src;
  uchar *__dest;
  ulong uVar1;
  ulong uVar2;
  
  __n = this->m_nDataSize;
  uVar1 = nSize + __n;
  if (this->m_nDataAlloc < uVar1) {
    uVar2 = this->m_nDataAlloc;
    if (uVar2 < uVar1) {
      do {
        uVar2 = uVar2 * 2;
      } while (uVar2 < uVar1);
      this->m_nDataAlloc = uVar2;
    }
    __dest = (uchar *)operator_new__(uVar2);
    __src = this->m_pauchData;
    memmove(__dest,__src,__n);
    if (__src != (uchar *)0x0 && __src != this->m_auchDataFast) {
      operator_delete__(__src);
    }
    this->m_pauchData = __dest;
  }
  return;
}

Assistant:

void MakeRoom (size_t nSize)
	{
		if (m_nDataSize + nSize > m_nDataAlloc)
		{
			while (m_nDataSize + nSize > m_nDataAlloc)
				m_nDataAlloc <<= 1;
			unsigned char *pauchNew = new unsigned char [m_nDataAlloc];
			memmove (pauchNew, m_pauchData, m_nDataSize);
			if (m_pauchData != m_auchDataFast)
				delete [] m_pauchData;
			m_pauchData = pauchNew;
		}
	}